

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowIcon(GLFWwindow *handle,int count,GLFWimage *images)

{
  GLFWimage *in_RDX;
  int in_ESI;
  _GLFWwindow *in_RDI;
  _GLFWwindow *window;
  int i;
  int local_1c;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (in_ESI < 0) {
    _glfwInputError(0x10004,"Invalid image count for window icon");
  }
  else {
    for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
      if ((in_RDX[local_1c].width < 1) || (in_RDX[local_1c].height < 1)) {
        _glfwInputError(0x10004,"Invalid image dimensions for window icon");
        return;
      }
    }
    (*_glfw.platform.setWindowIcon)(in_RDI,in_ESI,in_RDX);
  }
  return;
}

Assistant:

GLFWAPI void glfwSetWindowIcon(GLFWwindow* handle,
                               int count, const GLFWimage* images)
{
    int i;
    _GLFWwindow* window = (_GLFWwindow*) handle;

    assert(window != NULL);
    assert(count >= 0);
    assert(count == 0 || images != NULL);

    _GLFW_REQUIRE_INIT();

    if (count < 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid image count for window icon");
        return;
    }

    for (i = 0; i < count; i++)
    {
        assert(images[i].pixels != NULL);

        if (images[i].width <= 0 || images[i].height <= 0)
        {
            _glfwInputError(GLFW_INVALID_VALUE,
                            "Invalid image dimensions for window icon");
            return;
        }
    }

    _glfw.platform.setWindowIcon(window, count, images);
}